

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# item_event_visitor.hpp
# Opt level: O2

bool __thiscall
jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::visit_int64
          (basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_> *this,int64_t value
          ,semantic_tag tag,ser_context *context,error_code *ec)

{
  pointer plVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  size_type local_38;
  pointer local_30;
  
  plVar1 = (this->level_stack_).
           super__Vector_base<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((plVar1[-1].even_odd_ == 0) || (plVar1[-1].state_ == buffer)) {
    (this->key_)._M_string_length = 0;
    *(this->key_)._M_dataplus._M_p = '\0';
    detail::from_integer<long,std::__cxx11::string>(value,&this->key_);
    plVar1 = (this->level_stack_).
             super__Vector_base<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (plVar1[-1].even_odd_ == 0) {
      if (plVar1[-1].state_ == buffer) {
        if (plVar1[-1].count_ != 0) {
          std::__cxx11::string::push_back((char)this + '8');
        }
        _Var2._M_current = (this->key_)._M_dataplus._M_p;
        std::__cxx11::string::insert<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                  ((string *)&this->key_buffer_,
                   (const_iterator)
                   ((this->key_buffer_)._M_dataplus._M_p + (this->key_buffer_)._M_string_length),
                   _Var2,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(_Var2._M_current + (this->key_)._M_string_length));
        std::__cxx11::string::push_back((char)&this->key_buffer_);
      }
      else {
        local_30 = (this->key_)._M_dataplus._M_p;
        local_38 = (this->key_)._M_string_length;
        (*this->destination_->_vptr_basic_json_visitor[9])(this->destination_,&local_38,context,ec);
      }
      goto LAB_0018a6dd;
    }
    if (plVar1[-1].state_ == buffer) {
      if ((plVar1[-1].type_ != object) && (plVar1[-1].count_ != 0)) {
        std::__cxx11::string::push_back((char)this + '8');
      }
      _Var2._M_current = (this->key_)._M_dataplus._M_p;
      std::__cxx11::string::insert<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                ((string *)&this->key_buffer_,
                 (const_iterator)
                 ((this->key_buffer_)._M_dataplus._M_p + (this->key_buffer_)._M_string_length),_Var2
                 ,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   )(_Var2._M_current + (this->key_)._M_string_length));
      goto LAB_0018a6dd;
    }
  }
  (*this->destination_->_vptr_basic_json_visitor[0x10])
            (this->destination_,value,(ulong)tag,context,ec);
LAB_0018a6dd:
  level::advance((this->level_stack_).
                 super__Vector_base<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1);
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_int64(int64_t value, semantic_tag tag, const ser_context& context, std::error_code& ec) override
        {
            if (level_stack_.back().is_key() || level_stack_.back().target() == target_t::buffer)
            {
                key_.clear();
                jsoncons::detail::from_integer(value,key_);
            }

            if (level_stack_.back().is_key())
            {
                switch (level_stack_.back().target())
                {
                    case target_t::buffer:
                        if (level_stack_.back().count() > 0)
                        {
                            key_buffer_.push_back(',');
                        }
                        key_buffer_.insert(key_buffer_.end(), key_.begin(), key_.end());
                        key_buffer_.push_back(':');
                        break;
                    default:
                        destination_->key(key_, context, ec);
                        break;
                }
            }
            else
            {
                switch (level_stack_.back().target())
                {
                    case target_t::buffer:
                        if (!level_stack_.back().is_object() && level_stack_.back().count() > 0)
                        {
                            key_buffer_.push_back(',');
                        }
                        key_buffer_.insert(key_buffer_.end(), key_.begin(), key_.end());
                        break;
                    default:
                        destination_->int64_value(value, tag, context, ec);
                        break;
                }
            }

            level_stack_.back().advance();
            JSONCONS_VISITOR_RETURN;
        }